

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactor.c
# Opt level: O0

Interactor * interactor_toplevel(Interactor *itr,uint *level_out)

{
  uint local_24;
  Interactor *pIStack_20;
  uint level;
  Interactor *itr_top;
  uint *level_out_local;
  Interactor *itr_local;
  
  local_24 = 0;
  for (pIStack_20 = itr; pIStack_20->parent != (Interactor *)0x0; pIStack_20 = pIStack_20->parent) {
    local_24 = local_24 + 1;
  }
  if (level_out != (uint *)0x0) {
    *level_out = local_24;
  }
  return pIStack_20;
}

Assistant:

static Interactor *interactor_toplevel(Interactor *itr, unsigned *level_out)
{
    /*
     * Find the Interactor at the top of the chain, so that all the
     * Interactors in a stack can share that one's last-to-talk field.
     * Also, count how far we had to go to get to it, to put in the
     * message.
     */
    Interactor *itr_top = itr;
    unsigned level = 0;
    while (itr_top->parent) {
        itr_top = itr_top->parent;
        level++;
    }

    if (level_out)
        *level_out = level;
    return itr_top;
}